

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.h
# Opt level: O2

int __thiscall tinyxml2::XMLElement::IntAttribute(XMLElement *this,char *name)

{
  int i;
  int local_c;
  
  local_c = 0;
  QueryIntAttribute(this,name,&local_c);
  return local_c;
}

Assistant:

int		 IntAttribute( const char* name ) const		{
        int i=0;
        QueryIntAttribute( name, &i );
        return i;
    }